

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void __thiscall
dxil_spv::Converter::Impl::repack_sparse_feedback
          (Impl *this,ComponentType component_type,uint num_components,Value *value,
          Type *target_type,Id override_value)

{
  ComponentType element_type;
  Value *value_00;
  Id IVar1;
  Id type_id;
  Builder *this_00;
  Operation *pOVar2;
  Operation *this_01;
  Type *type;
  undefined7 in_register_00000031;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ComponentType component_type_local;
  Type *local_68;
  Id local_5c;
  Value *local_58;
  Operation *local_50;
  Id components [5];
  
  component_type_local = component_type;
  local_68 = target_type;
  this_00 = builder(this);
  IVar1 = spv::Builder::makeUintType(this_00,0x20);
  pOVar2 = allocate(this,OpCompositeExtract,IVar1);
  local_58 = value;
  IVar1 = get_id_for_value(this,value,0);
  Operation::add_id(pOVar2,IVar1);
  Operation::add_literal(pOVar2,0);
  add(this,pOVar2,false);
  iVar3 = (int)CONCAT71(in_register_00000031,component_type);
  if (iVar3 == 8) {
    component_type = F32;
  }
  else if (iVar3 == 3) {
    component_type = U32;
  }
  else if (iVar3 == 2) {
    component_type = I32;
  }
  if (override_value == 0) {
    IVar1 = get_type_id(this,component_type,1,num_components,false);
    this_01 = allocate(this,OpCompositeExtract,IVar1);
    IVar1 = get_id_for_value(this,local_58,0);
    Operation::add_id(this_01,IVar1);
    Operation::add_literal(this_01,1);
    add(this,this_01,false);
    override_value = this_01->id;
  }
  local_5c = override_value;
  fixup_load_type_typed(this,&component_type_local,num_components,&local_5c,local_68);
  IVar1 = local_5c;
  element_type = component_type_local;
  if (num_components < 2) {
    local_68 = (Type *)0x4;
    for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 4) {
      *(Id *)((long)components + lVar5) = local_5c;
    }
  }
  else {
    local_68 = (Type *)(ulong)num_components;
    local_50 = pOVar2;
    for (uVar4 = 0; pOVar2 = local_50, local_68 != (Type *)uVar4; uVar4 = uVar4 + 1) {
      type_id = get_type_id(this,element_type,1,1,false);
      pOVar2 = allocate(this,OpCompositeExtract,type_id);
      Operation::add_id(pOVar2,IVar1);
      Operation::add_literal(pOVar2,(uint32_t)uVar4);
      add(this,pOVar2,false);
      components[uVar4] = pOVar2->id;
    }
  }
  value_00 = local_58;
  components[(long)local_68] = pOVar2->id;
  type = LLVMBC::Value::getType(local_58);
  IVar1 = get_type_id(this,type,0);
  pOVar2 = allocate(this,OpCompositeConstruct,IVar1);
  for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 4) {
    Operation::add_id(pOVar2,*(Id *)((long)components + lVar5));
  }
  add(this,pOVar2,false);
  rewrite_value(this,value_00,pOVar2->id);
  return;
}

Assistant:

void Converter::Impl::repack_sparse_feedback(DXIL::ComponentType component_type, unsigned num_components, const llvm::Value *value,
                                             const llvm::Type *target_type, spv::Id override_value)
{
	auto *code_id = allocate(spv::OpCompositeExtract, builder().makeUintType(32));
	code_id->add_id(get_id_for_value(value));
	code_id->add_literal(0);
	add(code_id);

	auto effective_component_type = get_effective_typed_resource_type(component_type);
	spv::Id texel_id;

	if (override_value)
	{
		texel_id = override_value;
	}
	else
	{
		auto *texel = allocate(spv::OpCompositeExtract, get_type_id(effective_component_type, 1, num_components));
		texel->add_id(get_id_for_value(value));
		texel->add_literal(1);
		add(texel);
		texel_id = texel->id;
	}

	fixup_load_type_typed(component_type, num_components, texel_id, target_type);

	spv::Id components[5];

	if (num_components > 1)
	{
		for (unsigned i = 0; i < num_components; i++)
		{
			auto *extract_op = allocate(spv::OpCompositeExtract, get_type_id(component_type, 1, 1));
			extract_op->add_id(texel_id);
			extract_op->add_literal(i);
			add(extract_op);
			components[i] = extract_op->id;
		}
	}
	else
	{
		for (auto &comp : components)
			comp = texel_id;
		num_components = 4;
	}

	components[num_components] = code_id->id;

	auto *repack_op = allocate(spv::OpCompositeConstruct, get_type_id(value->getType()));
	for (auto &comp : components)
		repack_op->add_id(comp);
	add(repack_op);
	rewrite_value(value, repack_op->id);
}